

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O3

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  ushort *puVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  byte *__s;
  size_t sVar6;
  ushort **ppuVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  size_t uznum;
  bool bVar13;
  size_t outalloc;
  char ptag [80];
  char csub [80];
  char cmain [80];
  char patt [80];
  char couter [80];
  int local_200;
  int local_1fc;
  size_t local_1e8;
  byte *local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8 [80];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_1e8 = 0x100;
  *outlen = 0;
  pcVar5 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar5;
  if (pcVar5 == (char *)0x0) {
    return -1;
  }
  __s = (byte *)0x0;
  *pcVar5 = '\0';
  local_d8[0] = '\0';
  local_1c8[0] = '\0';
  local_178[0] = '\0';
  local_128[0] = '\0';
  local_88[0] = '\0';
  bVar2 = true;
  uznum = 0;
  local_1fc = 0;
  local_200 = 0;
  local_1d8 = sub;
  local_1d0 = main;
LAB_00103cf1:
  if (__s == (byte *)0x0) {
    uznum = 0x80;
    __s = (byte *)(*Curl_cmalloc)(0x80);
    if (__s == (byte *)0x0) {
      iVar4 = -1;
      goto LAB_0010411e;
    }
  }
  iVar4 = curlx_uztosi(uznum);
  pcVar5 = fgets((char *)__s,iVar4,(FILE *)stream);
  if (pcVar5 == (char *)0x0) {
LAB_0010414f:
    (*Curl_cfree)(__s);
    return 0;
  }
  uVar10 = 0;
  do {
    sVar6 = strlen((char *)(__s + uVar10));
    uVar10 = sVar6 + uVar10;
    if (__s[uVar10 - 1] == 10) goto LAB_00103da7;
    pbVar8 = __s;
    if (uznum - 1 <= uVar10) {
      uznum = uznum * 2;
      pbVar8 = (byte *)(*Curl_crealloc)(__s,uznum);
      if (pbVar8 == (byte *)0x0) {
        iVar4 = -1;
        goto LAB_00104115;
      }
    }
    __s = pbVar8;
    iVar4 = curlx_uztosi(uznum - uVar10);
    pcVar5 = fgets((char *)(__s + uVar10),iVar4,(FILE *)stream);
  } while (pcVar5 != (char *)0x0);
  if (uVar10 == 0) goto LAB_0010414f;
LAB_00103da7:
  bVar3 = *__s;
  if (bVar3 != 0) {
    ppuVar7 = __ctype_b_loc();
    puVar1 = *ppuVar7;
    lVar12 = 2;
    lVar11 = 0;
LAB_00103dbe:
    if ((*(byte *)((long)puVar1 + (ulong)bVar3 * 2 + 1) & 0x20) != 0) goto code_r0x00103dc9;
    if (bVar3 != 0x3c) goto LAB_00103ddf;
    bVar3 = __s[lVar12 + -1];
    if (bVar3 != 0x2f) {
      pbVar8 = __s + -lVar11;
      if (!bVar2) goto LAB_00103dea;
      while (((pbVar9 = pbVar8 + 1, bVar3 != 0 && (bVar3 != 0x3e)) &&
             ((puVar1[bVar3] & 0x2000) == 0))) {
        bVar3 = pbVar8[2];
        pbVar8 = pbVar9;
      }
      iVar4 = -2;
      if (0x4f < (long)(pbVar9 + (lVar11 - (long)__s) + -1)) goto LAB_00104115;
      local_1e0 = pbVar9;
      memcpy(local_1c8,__s + lVar12 + -1,(size_t)(pbVar9 + (lVar11 - (long)__s) + -1));
      local_1e0[(long)(local_1c8 + lVar11 + (-1 - (long)__s))] = 0;
      if ((local_1c8[0] != '!') && (local_1c8[0] != '?')) {
        bVar3 = *local_1e0;
        pbVar8 = local_1e0;
        while (bVar3 != 0) {
          if ((*(byte *)((long)puVar1 + (ulong)bVar3 * 2 + 1) & 0x20) == 0) goto LAB_00103f7d;
          pbVar9 = pbVar8 + 1;
          pbVar8 = pbVar8 + 1;
          bVar3 = *pbVar9;
        }
        bVar3 = 0;
LAB_00103f7d:
        sVar6 = 0;
        while ((bVar3 != 0 && (bVar3 != 0x3e))) {
          lVar11 = sVar6 + 1;
          sVar6 = sVar6 + 1;
          bVar3 = pbVar8[lVar11];
        }
        if (0x4f < (long)sVar6) goto LAB_00104115;
        memcpy(local_d8,pbVar8,sVar6);
        local_d8[sVar6] = '\0';
        if (local_200 == 0) {
          local_200 = 1;
          pcVar5 = local_88;
        }
        else {
          if (local_200 == 2) {
            strcpy(local_178,local_1c8);
            iVar4 = strcmp(local_128,local_1d0);
            local_200 = 3;
            bVar2 = true;
            if ((iVar4 == 0) && (iVar4 = strcmp(local_178,local_1d8), iVar4 == 0)) {
              pcVar5 = strstr(local_d8,"base64=");
              if (pcVar5 != (char *)0x0) {
                local_1fc = 1;
              }
              local_200 = 3;
              bVar2 = false;
            }
            goto LAB_00103cf1;
          }
          bVar13 = local_200 != 1;
          local_200 = 3;
          if (bVar13) goto LAB_00103ddf;
          local_200 = 2;
          pcVar5 = local_128;
        }
        strcpy(pcVar5,local_1c8);
      }
      bVar2 = true;
      goto LAB_00103cf1;
    }
    pbVar8 = __s + -lVar11 + 2;
    bVar3 = __s[lVar12];
    while (((bVar3 != 0 && (bVar3 != 0x3e)) && ((puVar1[bVar3] & 0x2000) == 0))) {
      bVar3 = pbVar8[1];
      pbVar8 = pbVar8 + 1;
    }
    if (0x4f < (long)(pbVar8 + (lVar11 - (long)__s) + -2)) {
      iVar4 = -2;
      goto LAB_00104115;
    }
    memcpy(local_1c8,__s + lVar12,(size_t)(pbVar8 + (lVar11 - (long)__s) + -2));
    pbVar8[(long)(local_1c8 + ((lVar11 + -2) - (long)__s))] = 0;
    if (local_200 == 1) {
      iVar4 = strcmp(local_88,local_1c8);
      local_200 = 1;
      if (iVar4 != 0) goto LAB_00103ddf;
      local_88[0] = '\0';
      local_200 = 0;
LAB_0010404e:
      if (!bVar2) goto LAB_0010414f;
      goto LAB_00103cf1;
    }
    if (local_200 == 2) {
      iVar4 = strcmp(local_128,local_1c8);
      local_200 = 2;
      if (iVar4 == 0) {
        local_128[0] = '\0';
        local_200 = 1;
        goto LAB_0010404e;
      }
    }
    else if (local_200 == 3) {
      iVar4 = strcmp(local_178,local_1c8);
      local_200 = 3;
      if (iVar4 == 0) {
        local_178[0] = '\0';
        local_200 = 2;
        goto LAB_0010404e;
      }
    }
  }
LAB_00103ddf:
  if (!bVar2) {
LAB_00103dea:
    iVar4 = appenddata(outbuf,outlen,&local_1e8,(char *)__s,local_1fc);
    if (iVar4 != 0) {
      iVar4 = -1;
LAB_00104115:
      (*Curl_cfree)(__s);
LAB_0010411e:
      if (*outbuf != (char *)0x0) {
        (*Curl_cfree)(*outbuf);
      }
      *outbuf = (char *)0x0;
      *outlen = 0;
      return iVar4;
    }
  }
  goto LAB_00103cf1;
code_r0x00103dc9:
  bVar3 = __s[lVar12 + -1];
  lVar11 = lVar11 + -1;
  lVar12 = lVar12 + 1;
  if (bVar3 == 0) goto LAB_00103ddf;
  goto LAB_00103dbe;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN+1]; /* current outermost section */
  char cmain[MAX_TAG_LEN+1];  /* current main section */
  char csub[MAX_TAG_LEN+1];   /* current sub section */
  char ptag[MAX_TAG_LEN+1];   /* potential tag */
  char patt[MAX_TAG_LEN+1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  if(buffer)
    free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      if(*outbuf)
        free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}